

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Record.cpp
# Opt level: O0

string * __thiscall gtar::Record::getPath_abi_cxx11_(string *__return_storage_ptr__,Record *this)

{
  Resolution RVar1;
  Behavior BVar2;
  long lVar3;
  ostream *poVar4;
  string local_398 [32];
  string local_378 [32];
  string local_358 [32];
  stringstream local_338 [8];
  stringstream result;
  ostream local_328 [392];
  stringstream local_1a0 [8];
  stringstream fullName;
  ostream local_190 [376];
  Record *local_18;
  Record *this_local;
  
  local_18 = this;
  this_local = (Record *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::operator<<(local_190,(string *)&this->m_name);
  if (this->m_resolution != Text) {
    switch(this->m_format) {
    case Float32:
      std::operator<<(local_190,".f32");
      break;
    case Float64:
      std::operator<<(local_190,".f64");
      break;
    case Int32:
      std::operator<<(local_190,".i32");
      break;
    case Int64:
      std::operator<<(local_190,".i64");
      break;
    case UInt8:
    default:
      std::operator<<(local_190,".u8");
      break;
    case UInt32:
      std::operator<<(local_190,".u32");
      break;
    case UInt64:
      std::operator<<(local_190,".u64");
    }
  }
  RVar1 = this->m_resolution;
  if (RVar1 != Text) {
    if (RVar1 == Uniform) {
      std::operator<<(local_190,".uni");
    }
    else if (RVar1 == Individual) {
      std::operator<<(local_190,".ind");
    }
  }
  std::__cxx11::stringstream::stringstream(local_338);
  lVar3 = std::__cxx11::string::size();
  if (lVar3 != 0) {
    poVar4 = std::operator<<(local_328,(string *)this);
    std::operator<<(poVar4,'/');
  }
  BVar2 = this->m_behavior;
  if (BVar2 != Constant) {
    if (BVar2 == Discrete) {
      poVar4 = std::operator<<(local_328,"frames/");
      poVar4 = std::operator<<(poVar4,(string *)&this->m_index);
      poVar4 = std::operator<<(poVar4,'/');
      std::__cxx11::stringstream::str();
      std::operator<<(poVar4,local_378);
      std::__cxx11::string::~string(local_378);
      goto LAB_00115f05;
    }
    if (BVar2 == Continuous) {
      poVar4 = std::operator<<(local_328,"vars/");
      std::__cxx11::stringstream::str();
      poVar4 = std::operator<<(poVar4,local_358);
      poVar4 = std::operator<<(poVar4,'/');
      std::operator<<(poVar4,(string *)&this->m_index);
      std::__cxx11::string::~string(local_358);
      goto LAB_00115f05;
    }
  }
  std::__cxx11::stringstream::str();
  std::operator<<(local_328,local_398);
  std::__cxx11::string::~string(local_398);
LAB_00115f05:
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_338);
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

string Record::getPath() const
    {
        stringstream fullName;
        fullName << m_name;

        if(m_resolution != Text)
        {
            switch(m_format)
            {
            case Float32:
                fullName << ".f32";
                break;
            case Float64:
                fullName << ".f64";
                break;
            case Int32:
                fullName << ".i32";
                break;
            case Int64:
                fullName << ".i64";
                break;
            case UInt32:
                fullName << ".u32";
                break;
            case UInt64:
                fullName << ".u64";
                break;
            case UInt8:
            default:
                fullName << ".u8";
            }
        }

        switch(m_resolution)
        {
        case Uniform:
            fullName << ".uni";
            break;
        case Individual:
            fullName << ".ind";
            break;
        case Text:
            // not handled
            break;
        }

        stringstream result;

        if(m_group.size())
            result << m_group << '/';

        switch(m_behavior)
        {
        case Continuous:
            result << "vars/" << fullName.str() << '/' << m_index;
            break;
        case Discrete:
            result << "frames/" << m_index << '/' << fullName.str();
            break;
        case Constant:
        default:
            result << fullName.str();
        }

        return result.str();
    }